

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

iterator * cs_impl::array_cs_ext::next(iterator *__return_storage_ptr__,iterator *it)

{
  std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator++
            (__return_storage_ptr__,it,0);
  return __return_storage_ptr__;
}

Assistant:

array::iterator next(array::iterator &it)
		{
			return it++;
		}